

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O0

Token slang::parsing::Token::createExpected
                (BumpAllocator *alloc,Diagnostics *diagnostics,Token actual,TokenKind expected,
                Token lastConsumed,Token matchingDelim)

{
  bool bVar1;
  size_type delta;
  SourceLocation *this;
  Diagnostic *pDVar2;
  SourceLocation noteLocation;
  string_view sVar3;
  Token TVar4;
  bool local_13a;
  bool local_139;
  Diagnostic *diag_1;
  SourceLocation local_88;
  reference local_80;
  Diagnostic *diag;
  undefined1 auStack_70 [7];
  bool report;
  SourceLocation local_60;
  SourceLocation local_58;
  SourceLocation local_50;
  SourceLocation local_48;
  SourceLocation location;
  TokenKind expected_local;
  Diagnostics *diagnostics_local;
  BumpAllocator *alloc_local;
  Token actual_local;
  
  actual_local._0_8_ = actual.info;
  alloc_local = actual._0_8_;
  location._6_2_ = expected;
  SourceLocation::SourceLocation(&local_48);
  bVar1 = operator_cast_to_bool(&lastConsumed);
  if (bVar1) {
    local_58 = Token::location(&lastConsumed);
    local_48 = local_58;
    _auStack_70 = rawText(&lastConsumed);
    delta = std::basic_string_view<char,_std::char_traits<char>_>::length
                      ((basic_string_view<char,_std::char_traits<char>_> *)auStack_70);
    local_60 = SourceLocation::operator+(&local_48,delta);
    local_48 = local_60;
  }
  else {
    local_50 = Token::location((Token *)&alloc_local);
    local_48 = local_50;
  }
  diag._7_1_ = 1;
  bVar1 = SmallVectorBase<slang::Diagnostic>::empty
                    ((SmallVectorBase<slang::Diagnostic> *)diagnostics);
  if (!bVar1) {
    local_80 = SmallVectorBase<slang::Diagnostic>::back
                         ((SmallVectorBase<slang::Diagnostic> *)diagnostics);
    bVar1 = Diagnostic::isError(local_80);
    local_139 = false;
    if (bVar1) {
      bVar1 = SourceLocation::operator==(&local_80->location,&local_48);
      local_13a = true;
      if (!bVar1) {
        this = &local_80->location;
        local_88 = Token::location((Token *)&alloc_local);
        local_13a = SourceLocation::operator==(this,&local_88);
      }
      local_139 = local_13a;
    }
    if (local_139 != false) {
      diag._7_1_ = 0;
    }
  }
  if ((diag._7_1_ & 1) != 0) {
    if (location._6_2_ == 2) {
      Diagnostics::add(diagnostics,(DiagCode)0x310005,local_48);
    }
    else if (location._6_2_ == 4) {
      Diagnostics::add(diagnostics,(DiagCode)0x440005,local_48);
    }
    else if (location._6_2_ == 5) {
      Diagnostics::add(diagnostics,(DiagCode)0x330005,local_48);
    }
    else if (location._6_2_ == 9) {
      Diagnostics::add(diagnostics,(DiagCode)0xa0004,local_48);
    }
    else if (location._6_2_ == 0x159) {
      Diagnostics::add(diagnostics,(DiagCode)0x40004,local_48);
    }
    else {
      pDVar2 = Diagnostics::add(diagnostics,(DiagCode)0x460005,local_48);
      sVar3 = LexerFacts::getTokenKindText(location._6_2_);
      Diagnostic::operator<<(pDVar2,sVar3);
      bVar1 = operator_cast_to_bool(&matchingDelim);
      if (bVar1) {
        noteLocation = Token::location(&matchingDelim);
        pDVar2 = Diagnostic::addNote(pDVar2,(DiagCode)0x900005,noteLocation);
        sVar3 = LexerFacts::getTokenKindText(matchingDelim.kind);
        Diagnostic::operator<<(pDVar2,sVar3);
      }
    }
  }
  TVar4 = createMissing(alloc,location._6_2_,local_48);
  return TVar4;
}

Assistant:

Token Token::createExpected(BumpAllocator& alloc, Diagnostics& diagnostics, Token actual,
                            TokenKind expected, Token lastConsumed, Token matchingDelim) {
    // Figure out the best place to report this error based on the current
    // token as well as the last real token we consumed.
    SourceLocation location;
    if (!lastConsumed)
        location = actual.location();
    else {
        location = lastConsumed.location();
        location = location + lastConsumed.rawText().length();
    }

    // If there is already a diagnostic issued for this location, don't report this
    // one as well since it will just lead to lots of spam and the first error is
    // probably the thing that actually caused the issue.
    bool report = true;
    if (!diagnostics.empty()) {
        const Diagnostic& diag = diagnostics.back();
        if (diag.isError() && (diag.location == location || diag.location == actual.location()))
            report = false;
    }

    if (report) {
        switch (expected) {
            case TokenKind::Identifier:
                diagnostics.add(diag::ExpectedIdentifier, location);
                break;
            case TokenKind::StringLiteral:
                diagnostics.add(diag::ExpectedStringLiteral, location);
                break;
            case TokenKind::IntegerLiteral:
                diagnostics.add(diag::ExpectedIntegerLiteral, location);
                break;
            case TokenKind::TimeLiteral:
                diagnostics.add(diag::ExpectedTimeLiteral, location);
                break;
            case TokenKind::IncludeFileName:
                diagnostics.add(diag::ExpectedIncludeFileName, location);
                break;
            default: {
                auto& diag = diagnostics.add(diag::ExpectedToken, location);
                diag << LexerFacts::getTokenKindText(expected);
                if (matchingDelim) {
                    diag.addNote(diag::NoteToMatchThis, matchingDelim.location())
                        << LexerFacts::getTokenKindText(matchingDelim.kind);
                }
                break;
            }
        }
    }
    return Token::createMissing(alloc, expected, location);
}